

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2sSpecialFloatTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles2::Stress::(anonymous_namespace)::UniformCase::genFragmentSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_a;
  allocator<char> local_9;
  
  if (*(int *)((long)this + 0x84) == 0) {
    __s = "varying mediump vec4 v_out;\nvoid main ()\n{\n\tgl_FragColor = v_out;\n}\n";
    __a = &local_9;
  }
  else {
    __s = 
    "uniform mediump vec4 u_special;\nvoid main ()\n{\n\tmediump vec2 a1 = u_special.xz + u_special.yw; // add\n\tmediump vec2 a2 = u_special.xz - u_special.yw; // sub\n\tmediump vec2 a3 = u_special.xz * u_special.yw; // mul\n\tmediump vec2 a4 = u_special.xz / u_special.yw; // div\n\tmediump vec2 a5 = u_special.xz + u_special.yw * u_special.xz; // fma\n\tmediump vec2 a6 = mod(u_special.xz, u_special.yw);\n\tmediump vec2 a7 = mix(u_special.xz, u_special.yw, a6);\n\n\tmediump float green = 1.0 - abs((a1.y + a2.y + a3.y + a4.y + a5.y + a6.y + a7.y) - 7.0);\n\tgl_FragColor = vec4(a1.x*a3.x, green, a5.x*a4.x + a2.x*a7.x, 1.0);\n}\n"
    ;
    __a = &local_a;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string UniformCase::genFragmentSource (void) const
{
	if (m_type == TYPE_VERTEX)
		return s_colorPassthroughFragmentShaderSource;
	else
		return
			"uniform mediump vec4 u_special;\n"
			"void main ()\n"
			"{\n"
			"	mediump vec2 a1 = u_special.xz + u_special.yw; // add\n"
			"	mediump vec2 a2 = u_special.xz - u_special.yw; // sub\n"
			"	mediump vec2 a3 = u_special.xz * u_special.yw; // mul\n"
			"	mediump vec2 a4 = u_special.xz / u_special.yw; // div\n"
			"	mediump vec2 a5 = u_special.xz + u_special.yw * u_special.xz; // fma\n"
			"	mediump vec2 a6 = mod(u_special.xz, u_special.yw);\n"
			"	mediump vec2 a7 = mix(u_special.xz, u_special.yw, a6);\n"
			"\n"
			"	mediump float green = 1.0 - abs((a1.y + a2.y + a3.y + a4.y + a5.y + a6.y + a7.y) - 7.0);\n"
			"	gl_FragColor = vec4(a1.x*a3.x, green, a5.x*a4.x + a2.x*a7.x, 1.0);\n"
			"}\n";
}